

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)0,std::__cxx11::string>
          (MessageLite *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool res;
  bool alias;
  MessageLite *in_stack_00000040;
  undefined1 in_stack_00000048 [16];
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool bVar2;
  
  StringPiece::StringPiece<std::allocator<char>>
            ((StringPiece *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_RDI);
  bVar1 = internal::MergePartialFromImpl<false>((StringPiece)in_stack_00000048,in_stack_00000040);
  bVar2 = false;
  if (bVar1) {
    bVar2 = IsInitializedWithErrors((MessageLite *)in_RDI);
  }
  return bVar2;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = flags & kMergeWithAliasing;
  bool res = internal::MergePartialFromImpl<alias>(input, this);
  return res && ((flags & kMergePartial) || IsInitializedWithErrors());
}